

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

ConstPixelBufferAccess *
tcu::getSubregion(ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *access,
                 int x,int y,int z,int width,int height,int depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TextureFormat *format;
  IVec3 *pitch;
  void *pvVar4;
  Vector<int,_3> local_34;
  int local_28;
  int local_24;
  int width_local;
  int z_local;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *access_local;
  
  local_28 = width;
  local_24 = z;
  width_local = y;
  z_local = x;
  _y_local = access;
  access_local = __return_storage_ptr__;
  format = ConstPixelBufferAccess::getFormat(access);
  Vector<int,_3>::Vector(&local_34,local_28,height,depth);
  pitch = ConstPixelBufferAccess::getPitch(_y_local);
  pvVar4 = ConstPixelBufferAccess::getDataPtr(_y_local);
  iVar1 = ConstPixelBufferAccess::getPixelPitch(_y_local);
  iVar1 = iVar1 * z_local;
  iVar2 = ConstPixelBufferAccess::getRowPitch(_y_local);
  iVar2 = iVar2 * width_local;
  iVar3 = ConstPixelBufferAccess::getSlicePitch(_y_local);
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,&local_34,pitch,
             (void *)((long)pvVar4 + (long)(iVar3 * local_24) + (long)iVar2 + (long)iVar1));
  return __return_storage_ptr__;
}

Assistant:

ConstPixelBufferAccess getSubregion (const ConstPixelBufferAccess& access, int x, int y, int z, int width, int height, int depth)
{
	DE_ASSERT(de::inBounds(x, 0, access.getWidth()));
	DE_ASSERT(de::inRange(x+width, x+1, access.getWidth()));

	DE_ASSERT(de::inBounds(y, 0, access.getHeight()));
	DE_ASSERT(de::inRange(y+height, y+1, access.getHeight()));

	DE_ASSERT(de::inBounds(z, 0, access.getDepth()));
	DE_ASSERT(de::inRange(z+depth, z+1, access.getDepth()));

	return ConstPixelBufferAccess(access.getFormat(), tcu::IVec3(width, height, depth), access.getPitch(),
								  (const deUint8*)access.getDataPtr() + access.getPixelPitch()*x + access.getRowPitch()*y + access.getSlicePitch()*z);
}